

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Server.h
# Opt level: O2

void __thiscall Server::handThisConn(Server *this)

{
  EventLoop *this_00;
  __shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  this_00 = this->loop_;
  std::__shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_28,
             &(this->acceptChannel_).super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>);
  EventLoop::updatePoller(this_00,(shared_ptr<Channel> *)&local_28,0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  return;
}

Assistant:

void handThisConn() { loop_->updatePoller(acceptChannel_); }